

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

void __thiscall
leveldb::anon_unknown_1::PosixRandomAccessFile::PosixRandomAccessFile
          (PosixRandomAccessFile *this,string *filename,int fd,Limiter *fd_limiter)

{
  bool bVar1;
  Limiter *in_RCX;
  int in_EDX;
  string *in_RSI;
  RandomAccessFile *in_RDI;
  int local_3c;
  
  RandomAccessFile::RandomAccessFile(in_RDI);
  in_RDI->_vptr_RandomAccessFile = (_func_int **)&PTR__PosixRandomAccessFile_0012ca00;
  bVar1 = Limiter::Acquire(in_RCX);
  *(bool *)&in_RDI[1]._vptr_RandomAccessFile = bVar1;
  local_3c = in_EDX;
  if (((ulong)in_RDI[1]._vptr_RandomAccessFile & 1) == 0) {
    local_3c = -1;
  }
  *(int *)((long)&in_RDI[1]._vptr_RandomAccessFile + 4) = local_3c;
  in_RDI[2]._vptr_RandomAccessFile = (_func_int **)in_RCX;
  std::__cxx11::string::string((string *)(in_RDI + 3),in_RSI);
  if (((ulong)in_RDI[1]._vptr_RandomAccessFile & 1) == 0) {
    close(in_EDX);
  }
  return;
}

Assistant:

PosixRandomAccessFile(std::string filename, int fd, Limiter* fd_limiter)
      : has_permanent_fd_(fd_limiter->Acquire()),
        fd_(has_permanent_fd_ ? fd : -1),
        fd_limiter_(fd_limiter),
        filename_(std::move(filename)) {
    if (!has_permanent_fd_) {
      assert(fd_ == -1);
      ::close(fd);  // The file will be opened on every read.
    }
  }